

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLUri::setPort(XMLUri *this,int newPort)

{
  MalformedURLException *pMVar1;
  XMLCh value1 [65];
  
  if ((uint)newPort < 0x10000) {
    if (this->fHost == (XMLCh *)0x0) {
      XMLString::binToText(newPort,value1,0x40,10,this->fMemoryManager);
      pMVar1 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x4cb,XMLNUM_URI_NullHost,(XMLCh *)errMsg_PORT,value1,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      __cxa_throw(pMVar1,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
  }
  else if (newPort != -1) {
    XMLString::binToText(newPort,value1,0x40,10,this->fMemoryManager);
    pMVar1 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x4d5,XMLNUM_URI_PortNo_Invalid,value1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(pMVar1,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  this->fPort = newPort;
  return;
}

Assistant:

void XMLUri::setPort(int newPort)
{
    if (newPort >= 0 && newPort <= 65535)
    {
        if (!getHost())
        {
            XMLCh value1[BUF_LEN+1];
            XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_NullHost
                    , errMsg_PORT
                    , value1
                    , fMemoryManager);
        }
    }
    else if (newPort != -1)
    {
        XMLCh value1[BUF_LEN+1];
        XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_PortNo_Invalid
                , value1
                , fMemoryManager);
    }

    fPort = newPort;
}